

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# use_template_class.cpp
# Opt level: O2

void use_template_class(void)

{
  Stack<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> ss;
  string str;
  
  L14_4::Stack<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  Stack(&ss,10);
  str._M_dataplus._M_p = (pointer)&str.field_2;
  str._M_string_length = 0;
  str.field_2._M_local_buf[0] = '\0';
  std::operator<<((ostream *)&std::cout,"Please add something to stack(q to quit):\n");
}

Assistant:

void use_template_class() {
    using namespace L14_4;

    // string stack
    Stack<std::string> ss;
    std::string str;

    std::cout << "Please add something to stack(q to quit):\n";
    while(std::cin >> str && str != "q" && !ss.is_full()) {
        ss.push(str);
        std::cout << "then again with stack(q to quit):\n";
    }
    if (ss.is_full()) {
        std::cout << "stack is full.\n";
    } else {
        std::cout << "ok, leave stack...\n";
    }
}